

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_fp32_to_bf16_row_ref(float *x,ggml_bf16_t *y,int64_t n)

{
  float fVar1;
  long lVar2;
  ushort uVar3;
  
  if (0 < n) {
    lVar2 = 0;
    do {
      fVar1 = x[lVar2];
      if ((uint)ABS(fVar1) < 0x7f800001) {
        uVar3 = (ushort)(((uint)fVar1 >> 0x10 & 1) + (int)fVar1 + 0x7fff >> 0x10);
      }
      else {
        uVar3 = (ushort)((uint)fVar1 >> 0x10) | 0x40;
      }
      y[lVar2].bits = uVar3;
      lVar2 = lVar2 + 1;
    } while (n != lVar2);
  }
  return;
}

Assistant:

void ggml_fp32_to_bf16_row_ref(const float * x, ggml_bf16_t * y, int64_t n) {
    for (int i = 0; i < n; i++) {
        y[i] = ggml_compute_fp32_to_bf16(x[i]);
    }
}